

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O1

void __thiscall
VectorFormatter<DefaultFormatter>::
Ser<ParamsStream<DataStream&,serialize_tests::BaseFormat>,std::vector<serialize_tests::Base,std::allocator<serialize_tests::Base>>>
          (VectorFormatter<DefaultFormatter> *this,
          ParamsStream<DataStream_&,_serialize_tests::BaseFormat> *s,
          vector<serialize_tests::Base,_std::allocator<serialize_tests::Base>_> *v)

{
  long lVar1;
  pointer pBVar2;
  value_type *elem;
  pointer this_00;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  WriteCompactSize<ParamsStream<DataStream&,serialize_tests::BaseFormat>>
            (s,(long)(v->
                     super__Vector_base<serialize_tests::Base,_std::allocator<serialize_tests::Base>_>
                     )._M_impl.super__Vector_impl_data._M_finish -
               (long)(v->
                     super__Vector_base<serialize_tests::Base,_std::allocator<serialize_tests::Base>_>
                     )._M_impl.super__Vector_impl_data._M_start);
  pBVar2 = (v->super__Vector_base<serialize_tests::Base,_std::allocator<serialize_tests::Base>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  for (this_00 = (v->
                 super__Vector_base<serialize_tests::Base,_std::allocator<serialize_tests::Base>_>).
                 _M_impl.super__Vector_impl_data._M_start; this_00 != pBVar2; this_00 = this_00 + 1)
  {
    serialize_tests::Base::Serialize<ParamsStream<DataStream&,serialize_tests::BaseFormat>>
              (this_00,s);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Ser(Stream& s, const V& v)
    {
        Formatter formatter;
        WriteCompactSize(s, v.size());
        for (const typename V::value_type& elem : v) {
            formatter.Ser(s, elem);
        }
    }